

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldExpandGroup
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  Builder decl_00;
  uint uVar1;
  Builder *in_RCX;
  Reader value;
  Reader value_00;
  StringPtr description;
  Builder field;
  Builder local_138;
  OrphanBuilder local_108;
  Builder newField;
  Builder newDecl;
  ChangeInfo local_98;
  Builder local_78;
  Builder local_48;
  
  Declaration::Builder::initNestedDecls((Builder *)&field,&decl,1);
  capnp::_::ListBuilder::getStructElement(&newDecl._builder,(ListBuilder *)&field,0);
  Declaration::Builder::disownName((Orphan<capnp::compiler::LocatedText> *)&field,&decl);
  Declaration::Builder::adoptName
            ((Builder *)&newDecl._builder,(Orphan<capnp::compiler::LocatedText> *)&field);
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&field);
  field._builder.dataSize = newDecl._builder.dataSize;
  field._builder.pointerCount = newDecl._builder.pointerCount;
  field._builder._38_2_ = newDecl._builder._38_2_;
  field._builder.data = newDecl._builder.data;
  field._builder.pointers = newDecl._builder.pointers;
  field._builder.segment = newDecl._builder.segment;
  field._builder.capTable = newDecl._builder.capTable;
  newField._builder.dataSize = decl._builder.dataSize;
  newField._builder.pointerCount = decl._builder.pointerCount;
  newField._builder._38_2_ = decl._builder._38_2_;
  newField._builder.data = decl._builder.data;
  newField._builder.pointers = decl._builder.pointers;
  newField._builder.segment = decl._builder.segment;
  newField._builder.capTable = decl._builder.capTable;
  Declaration::Id::Builder::disownOrdinal
            ((Orphan<capnp::compiler::LocatedInteger> *)&local_138,(Builder *)&newField);
  Declaration::Id::Builder::adoptOrdinal
            ((Builder *)&field,(Orphan<capnp::compiler::LocatedInteger> *)&local_138);
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_138);
  field._builder.dataSize = decl._builder.dataSize;
  field._builder.pointerCount = decl._builder.pointerCount;
  field._builder._38_2_ = decl._builder._38_2_;
  field._builder.data = decl._builder.data;
  field._builder.pointers = decl._builder.pointers;
  field._builder.segment = decl._builder.segment;
  field._builder.capTable = decl._builder.capTable;
  Declaration::Builder::initField(&newField,&newDecl);
  Declaration::Field::Builder::disownType((Orphan<capnp::compiler::Expression> *)&local_138,&field);
  Declaration::Field::Builder::adoptType
            (&newField,(Orphan<capnp::compiler::Expression> *)&local_138);
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_138);
  if (*(short *)((long)field._builder.data + 0xc) == 1) {
    local_138._builder.dataSize = newField._builder.dataSize;
    local_138._builder.pointerCount = newField._builder.pointerCount;
    local_138._builder._38_2_ = newField._builder._38_2_;
    local_138._builder.data = newField._builder.data;
    local_138._builder.pointers = newField._builder.pointers;
    local_138._builder.segment = newField._builder.segment;
    local_138._builder.capTable = newField._builder.capTable;
    local_78._builder.dataSize = field._builder.dataSize;
    local_78._builder.pointerCount = field._builder.pointerCount;
    local_78._builder._38_2_ = field._builder._38_2_;
    local_78._builder.data = field._builder.data;
    local_78._builder.pointers = field._builder.pointers;
    local_78._builder.segment = field._builder.segment;
    local_78._builder.capTable = field._builder.capTable;
    Declaration::Field::DefaultValue::Builder::disownValue
              ((Orphan<capnp::compiler::Expression> *)&local_108,&local_78);
    Declaration::Field::DefaultValue::Builder::adoptValue
              (&local_138,(Orphan<capnp::compiler::Expression> *)&local_108);
    capnp::_::OrphanBuilder::~OrphanBuilder(&local_108);
  }
  else {
    *(undefined2 *)((long)newField._builder.data + 0xc) = 0;
  }
  Declaration::Builder::initName((Builder *)&local_138,&decl);
  Declaration::Builder::getName((Builder *)&local_78,&newDecl);
  LocatedText::Builder::getValue(&local_48,(Builder *)&local_78);
  kj::str<char_const(&)[2],capnp::Text::Builder>
            ((String *)&local_108,(kj *)0x1be697,(char (*) [2])&local_48,in_RCX);
  if (local_108.segment == (SegmentBuilder *)0x0) {
    local_108.tag.content = 0x1bf653;
  }
  value.super_StringPtr.content.size_ =
       (long)&((local_108.segment)->super_SegmentReader).arena +
       (ulong)(local_108.segment == (SegmentBuilder *)0x0);
  value.super_StringPtr.content.ptr = (char *)local_108.tag.content;
  LocatedText::Builder::setValue((Builder *)&local_138,value);
  kj::Array<char>::~Array((Array<char> *)&local_108);
  *(undefined2 *)decl._builder.data = 0;
  uVar1 = rand();
  if ((uVar1 & 1) == 0) {
    *(undefined2 *)((long)decl._builder.data + 2) = 8;
  }
  else {
    *(undefined2 *)((long)decl._builder.data + 2) = 7;
    if ((!scopeHasUnion) && (uVar1 = rand(), (uVar1 & 1) == 0)) {
      Declaration::Builder::getName((Builder *)&local_138,&decl);
      value_00.super_StringPtr.content.size_ = 1;
      value_00.super_StringPtr.content.ptr = "";
      LocatedText::Builder::setValue((Builder *)&local_138,value_00);
    }
    decl_00._builder.capTable = decl._builder.capTable;
    decl_00._builder.segment = decl._builder.segment;
    decl_00._builder.data = decl._builder.data;
    decl_00._builder.pointers = decl._builder.pointers;
    decl_00._builder.dataSize = decl._builder.dataSize;
    decl_00._builder.pointerCount = decl._builder.pointerCount;
    decl_00._builder._38_2_ = decl._builder._38_2_;
    structAddField(&local_98,decl_00,nextOrdinal,false);
    kj::Array<char>::~Array(&local_98.description.content);
  }
  description.content.size_ = 0x23;
  description.content.ptr = "Wrap a field in a singleton group.";
  ChangeInfo::ChangeInfo(__return_storage_ptr__,COMPATIBLE,description);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldExpandGroup(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  Declaration::Builder newDecl = decl.initNestedDecls(1)[0];
  newDecl.adoptName(decl.disownName());
  newDecl.getId().adoptOrdinal(decl.getId().disownOrdinal());

  auto field = decl.getField();
  auto newField = newDecl.initField();

  newField.adoptType(field.disownType());
  if (field.getDefaultValue().isValue()) {
    newField.getDefaultValue().adoptValue(field.getDefaultValue().disownValue());
  } else {
    newField.getDefaultValue().setNone();
  }

  decl.initName().setValue(kj::str("g", newDecl.getName().getValue()));
  decl.getId().setUnspecified();

  if (rand() % 2 == 0) {
    decl.setGroup();
  } else {
    decl.setUnion();
    if (!scopeHasUnion && rand() % 2 == 0) {
      // Make it an unnamed union.
      decl.getName().setValue("");
    }
    structAddField(decl, nextOrdinal, scopeHasUnion);  // union must have two members
  }

  return { COMPATIBLE, "Wrap a field in a singleton group." };
}